

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

int get_branchlength(uint32_t **pptrptr,int *minptr,int *errcodeptr,int *lcptr,
                    parsed_recurse_check *recurses,compile_block_8 *cb)

{
  parsed_recurse_check *ppVar1;
  ushort uVar2;
  int iVar3;
  BOOL BVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint16_t *puVar15;
  uint32_t uVar16;
  uint32_t *local_98;
  compile_block_8 *local_90;
  int groupminlength;
  parsed_recurse_check *local_80;
  size_t local_78;
  int *local_70;
  int *local_68;
  uint32_t **local_60;
  int *local_58;
  PCRE2_SPTR8 local_50;
  uint32_t *local_48;
  parsed_recurse_check this_recurse;
  
  puVar7 = *pptrptr;
  iVar13 = *lcptr;
  *lcptr = iVar13 + 1;
  if (2000 < iVar13) {
    *errcodeptr = 0x87;
    return -1;
  }
  uVar12 = 0;
  uVar11 = 0;
  iVar13 = 0;
  uVar10 = 0;
  local_90 = cb;
  local_80 = recurses;
  local_70 = lcptr;
  local_60 = pptrptr;
  local_58 = minptr;
LAB_0018ac91:
  uVar5 = *puVar7;
  uVar14 = 1;
  local_98 = puVar7;
  if (-1 < (int)uVar5) {
    uVar8 = 1;
    goto switchD_0018ad07_caseD_b;
  }
  uVar9 = 1;
  uVar8 = 1;
  uVar16 = 0;
  iVar3 = (int)uVar11;
  switch(uVar5 + 0x7fff0000 >> 0x10) {
  case 0:
  case 0x18:
    goto switchD_0018ad07_caseD_0;
  case 1:
  case 0x19:
  case 0x21:
    goto switchD_0018ad07_caseD_1;
  case 2:
    if (((local_90->external_options & 0x200) != 0) || ((local_90->external_flags & 0x200000) != 0))
    goto switchD_0018ad07_caseD_a;
    uVar12 = uVar5 & 0xffff;
    if (9 < uVar12) goto LAB_0018b024;
    local_78 = local_90->small_ref_offset[uVar12];
    goto LAB_0018b03e;
  case 3:
    if ((local_90->external_options & 0x200) != 0) goto switchD_0018ad07_caseD_a;
  case 0x20:
    uVar12 = puVar7[1];
    local_98 = puVar7 + 3;
    local_78 = CONCAT44(puVar7[2],puVar7[3]);
    uVar2 = local_90->names_found;
    local_68 = errcodeptr;
    if (uVar2 != 0) {
      local_50 = local_90->start_pattern + local_78;
      puVar15 = &local_90->named_groups->isdup;
      uVar14 = 0;
      do {
        if (uVar12 == puVar15[-1]) {
          iVar3 = coda__pcre2_strncmp_8
                            (local_50,((named_group_8 *)(puVar15 + -7))->name,(ulong)uVar12);
          if (iVar3 == 0) goto LAB_0018b175;
          uVar2 = local_90->names_found;
        }
        uVar14 = uVar14 + 1;
        puVar15 = puVar15 + 8;
        if (uVar2 <= uVar14) break;
      } while( true );
    }
    goto LAB_0018b1d7;
  case 4:
    local_98 = puVar7 + 1;
    goto switchD_0018ad07_caseD_b;
  case 5:
    local_98 = puVar7 + 3;
    break;
  case 6:
    local_98 = puVar7 + 5;
    break;
  case 7:
    uVar16 = uVar5 & 0xffff;
switchD_0018ad07_caseD_1:
    local_98 = puVar7 + 1;
LAB_0018afe0:
    uVar14 = get_grouplength(&local_98,&groupminlength,1,errcodeptr,local_70,uVar16,local_80,
                             local_90);
    uVar8 = groupminlength;
    if ((int)uVar14 < 0) {
      return -1;
    }
    goto switchD_0018ad07_caseD_b;
  case 8:
  case 0x15:
  case 0x2b:
  case 0x2d:
  case 0x2f:
  case 0x31:
    break;
  case 9:
  case 0xd:
    local_98 = parsed_skip(puVar7,1);
    uVar8 = 1;
    if (local_98 == (uint32_t *)0x0) goto LAB_0018b235;
    goto switchD_0018ad07_caseD_b;
  default:
    goto switchD_0018ad07_caseD_a;
  case 0xb:
  case 0x16:
    goto switchD_0018ad07_caseD_b;
  case 0xe:
    local_98 = puVar7 + 1;
    goto LAB_0018ad10;
  case 0xf:
    local_98 = parsed_skip(puVar7 + 1,2);
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    local_98 = puVar7 + 4;
LAB_0018ad10:
    uVar16 = 0;
    goto LAB_0018afe0;
  case 0x17:
    uVar14 = 2;
    if ((short)uVar5 != 0x11) {
      uVar5 = uVar5 & 0xffff;
      if (uVar5 == 0x16) {
        return -1;
      }
      if (0x10 < uVar5 - 6) break;
      if ((uVar5 == 0xe) && ((local_90->external_options & 0x80000) != 0)) {
        *errcodeptr = 0x88;
        return -1;
      }
      if (uVar5 - 0xf < 2) {
        local_98 = puVar7 + 1;
      }
      uVar14 = 1;
    }
    goto switchD_0018ad07_caseD_b;
  case 0x1a:
    local_98 = puVar7 + 2;
    break;
  case 0x1f:
LAB_0018b024:
    uVar12 = uVar5 & 0xffff;
    local_78 = CONCAT44(puVar7[1],puVar7[2]);
    local_98 = puVar7 + 2;
    goto LAB_0018b03e;
  case 0x22:
  case 0x23:
  case 0x26:
    iVar3 = check_lookbehinds(puVar7 + 1,&local_98,local_80,local_90,local_70);
    *errcodeptr = iVar3;
    if (iVar3 != 0) {
      return -1;
    }
    uVar12 = local_98[1] << 0x10 | local_98[1] + 0x7fcc0000 >> 0x10;
    if (uVar12 < 9) {
      local_98 = local_98 + 1;
    }
    else if (uVar12 - 9 < 3) {
      local_98 = local_98 + 3;
    }
    break;
  case 0x24:
  case 0x25:
  case 0x27:
    BVar4 = set_lookbehind_lengths(&local_98,errcodeptr,local_70,local_80,local_90);
    uVar14 = 0;
    uVar12 = 0;
    if (BVar4 == 0) {
      return -1;
    }
    goto LAB_0018acb7;
  case 0x28:
  case 0x2c:
  case 0x2e:
  case 0x30:
  case 0x32:
    local_98 = puVar7 + (puVar7[1] + 1);
    break;
  case 0x29:
  case 0x2a:
    puVar7 = parsed_skip(puVar7,0);
    if (puVar7 == (uint32_t *)0x0) goto LAB_0018b235;
switchD_0018ad07_caseD_0:
    *local_60 = puVar7;
    *local_58 = iVar13;
    return uVar10;
  case 0x39:
  case 0x3a:
  case 0x3b:
    goto switchD_0018ad07_caseD_39;
  case 0x3c:
  case 0x3d:
  case 0x3e:
    uVar16 = puVar7[1];
    uVar9 = puVar7[2];
    local_98 = puVar7 + 2;
    if (uVar9 == 0x10000) goto switchD_0018ad07_caseD_a;
switchD_0018ad07_caseD_39:
    if (((iVar3 == 0) || (uVar9 == 0)) || (uVar9 - 1 <= (uint)((uVar10 ^ 0x7fffffff) / uVar11))) {
      uVar14 = 0;
      uVar5 = 0;
      if (uVar16 == 0) {
        uVar5 = uVar12;
      }
      uVar8 = (uVar16 - 1) * uVar12;
      if (uVar16 == 0) {
        uVar8 = uVar14;
      }
      iVar13 = iVar13 - uVar5;
      if (uVar9 != 0) {
        uVar14 = (uVar9 - 1) * iVar3;
        goto switchD_0018ad07_caseD_b;
      }
      uVar10 = uVar10 - iVar3;
      uVar12 = uVar8;
      goto LAB_0018acb7;
    }
LAB_0018b1bb:
    *errcodeptr = 0xbb;
    return -1;
  }
  uVar14 = 0;
  uVar12 = 0;
  goto LAB_0018acb7;
LAB_0018b175:
  uVar12 = *(uint *)(puVar15 + -3);
  if (uVar12 == 0) {
LAB_0018b1d7:
    *local_68 = 0x73;
    local_90->erroroffset = local_78;
    return -1;
  }
  errcodeptr = local_68;
  if (((uVar5 & 0xffff0000) == 0x80210000) ||
     ((*puVar15 == 0 && ((local_90->external_flags & 0x200000) == 0)))) {
LAB_0018b03e:
    if (local_90->bracount < uVar12) {
      local_90->erroroffset = local_78;
      *errcodeptr = 0x73;
      return -1;
    }
    if (uVar12 != 0) {
      puVar7 = local_90->parsed_pattern;
      uVar16 = *puVar7;
      do {
        if ((uVar16 & 0xffff0000) == 0x80050000) {
          puVar7 = puVar7 + 1;
        }
        else if (uVar16 == (uVar12 | 0x80080000)) goto LAB_0018b0a1;
        uVar16 = puVar7[1];
        puVar7 = puVar7 + 1;
      } while( true );
    }
  }
  goto switchD_0018ad07_caseD_a;
LAB_0018b0a1:
  local_48 = puVar7;
  puVar6 = parsed_skip(puVar7 + 1,2);
  if (puVar6 == (uint32_t *)0x0) {
LAB_0018b235:
    *errcodeptr = 0xbe;
    return -1;
  }
  ppVar1 = local_80;
  if (local_98 <= puVar7 || puVar6 <= local_98) {
    for (; ppVar1 != (parsed_recurse_check *)0x0; ppVar1 = ppVar1->prev) {
      if (ppVar1->groupptr == puVar7) goto switchD_0018ad07_caseD_a;
    }
    this_recurse.prev = local_80;
    local_48 = puVar7 + 1;
    this_recurse.groupptr = puVar7;
    uVar14 = get_grouplength(&local_48,&groupminlength,0,errcodeptr,local_70,uVar12,&this_recurse,
                             local_90);
    uVar8 = groupminlength;
    if (-1 < (int)uVar14) {
switchD_0018ad07_caseD_b:
      uVar12 = uVar8;
      if ((int)(uVar10 ^ 0x7fffffff) < (int)uVar14) goto LAB_0018b1bb;
LAB_0018acb7:
      uVar10 = uVar10 + uVar14;
      if (0xffff < (int)uVar10) goto LAB_0018b1bb;
      iVar13 = iVar13 + uVar12;
      puVar7 = local_98 + 1;
      uVar11 = (ulong)uVar14;
      goto LAB_0018ac91;
    }
    if (*errcodeptr != 0) {
      return -1;
    }
  }
switchD_0018ad07_caseD_a:
  *errcodeptr = 0x7d;
  return -1;
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *minptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int branchminlength = 0;
int grouplength, groupminlength;
uint32_t lastitemlength = 0;
uint32_t lastitemminlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;
  uint32_t itemminlength = 0;
  uint32_t min, max;

  if (*pptr < META_END)
    {
    itemlength = itemminlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 2;
    break;

    case META_BIGVALUE:
    itemlength = itemminlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = itemminlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = itemminlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R can match one or two
    characters, but \X is never allowed because it matches an unknown number of
    characters. \C is allowed only in 32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_X) return -1;
    if (escape == ESC_R)
      {
      itemminlength = 1;
      itemlength = 2;
      }
    else if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = itemminlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads do not contribute to the length of this branch, but they may
    contain lookbehinds within them whose lengths need to be set. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    *errcodeptr = check_lookbehinds(pptr + 1, &pptr, recurses, cb, lcptr);
    if (*errcodeptr != 0) return -1;

    /* Ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* A nested lookbehind does not contribute any length to this lookbehind,
    but must itself be checked and have its lengths set. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, &groupminlength, FALSE, errcodeptr,
      lcptr, group, &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    /* A (DEFINE) group is never obeyed inline and so it does not contribute to
    the length of this branch. Skip from the following item to the next
    unpaired ket. */

    case META_COND_DEFINE:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    break;

    /* Check other nested groups - advance past the initial data for each type
    and then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, &groupminlength, TRUE, errcodeptr,
      lcptr, group, recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    min = 0;
    max = 1;
    goto REPETITION;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    min = pptr[1];
    max = pptr[2];
    pptr += 2;

    REPETITION:
    if (max != REPEAT_UNLIMITED)
      {
      if (lastitemlength != 0 &&  /* Should not occur, but just in case */
          max != 0 &&
          (INT_MAX - branchlength)/lastitemlength < max - 1)
        {
        *errcodeptr = ERR87;  /* Integer overflow; lookbehind too big */
        return -1;
        }
      if (min == 0) branchminlength -= lastitemminlength;
        else itemminlength = (min - 1) * lastitemminlength;
      if (max == 0) branchlength -= lastitemlength;
        else itemlength = (max - 1) * lastitemlength;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, checking for integer overflow and
  for the branch length exceeding the overall limit. Later, if there is at
  least one variable-length branch in the group, there is a test for the
  (smaller) variable-length branch length limit. */

  if (INT_MAX - branchlength < (int)itemlength ||
      (branchlength += itemlength) > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }

  branchminlength += itemminlength;

  /* Save this item length for use if the next item is a quantifier. */

  lastitemlength = itemlength;
  lastitemminlength = itemminlength;
  }

EXIT:
*pptrptr = pptr;
*minptr = branchminlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}